

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O3

int webSocket_recv(int fd,uchar *data,uint dataMaxLen)

{
  uint uVar1;
  int iVar2;
  uchar *data_00;
  ssize_t sVar3;
  uchar *package;
  uint dataLen;
  uint retLen;
  uint local_3c;
  uchar *local_38;
  
  local_3c = 0;
  data_00 = (uchar *)calloc(1,(ulong)dataMaxLen);
  sVar3 = recv(fd,data_00,(ulong)dataMaxLen,0x4000);
  dataLen = (uint)sVar3;
  if ((int)dataLen < 1) {
    free(data_00);
  }
  else {
    local_38 = data;
    package = (uchar *)calloc(1,(ulong)(dataLen + 0x80));
    iVar2 = webSocket_dePackage(data_00,dataLen,package,dataLen + 0x80,&local_3c);
    uVar1 = local_3c;
    if (local_3c == 0 || iVar2 != -0x10) {
      if ((local_3c == 0) || (2 < iVar2 + 0x14U)) {
        free(data_00);
        free(package);
        dataLen = -dataLen;
      }
      else {
        memcpy(local_38,package,(ulong)local_3c);
        free(data_00);
        free(package);
        dataLen = uVar1;
      }
    }
    else {
      webSocket_send(fd,package,local_3c,true,WCT_PONG);
      printf("webSocket_recv : PING %d\r\n%s\r\n",(ulong)uVar1,package);
      free(data_00);
      free(package);
      dataLen = 0;
    }
  }
  return dataLen;
}

Assistant:

int webSocket_recv(int fd, unsigned char *data, unsigned int dataMaxLen) {
    unsigned char *webSocketPackage, *recvBuf;
    int ret, ret2 = 0;
    unsigned int retLen = 0;
    //int i;

    recvBuf = (unsigned char *)calloc(1, sizeof(char)*dataMaxLen);  memset(recvBuf, 0, dataMaxLen);
    ret = (unsigned int)recv(fd, recvBuf, dataMaxLen, MSG_NOSIGNAL);
    if(ret > 0)
    {
        //------------------------------------------------------------------- 和客户端的连接操作
//        if(strncmp(recvBuf, "GET", 3) == 0)
//        {
//            ret2 = webSocket_serverLinkToClient(fd, recvBuf, ret);
//            free(recvBuf);
//            if(ret2 < 0)
//            {
//                memset(data, 0, dataMaxLen);
//                strcpy(data, "connect false !\r\n");
//                return strlen("connect false !\r\n");
//            }
//            memset(data, 0, dataMaxLen);
//            strcpy(data, "connect ...\r\n");
//            return strlen("connect ...\r\n");
//        }

        //------------------------------------------------------------------- 正常数据交换

        //printf("webSocket_recv : %d\r\n", ret);
        //---------- websocket数据打包 ----------
        webSocketPackage = (unsigned char *)calloc(1, sizeof(char)*(ret + 128));  memset(webSocketPackage, 0, (ret + 128));
        ret2 = webSocket_dePackage(recvBuf, (unsigned int)ret, webSocketPackage, (unsigned int)(ret + 128), &retLen);
        if(ret2 == WCT_PING && retLen > 0)      // 解析为ping包, 自动回pong
        {
            webSocket_send(fd, webSocketPackage, retLen, true, WCT_PONG);
            // 显示数据
            printf("webSocket_recv : PING %d\r\n%s\r\n" , retLen, webSocketPackage);
            free(recvBuf);
            free(webSocketPackage);
            return WCT_NULL;
        }
        else if(retLen > 0 && (ret2 == WCT_TXTDATA || ret2 == WCT_BINDATA || ret2 == WCT_MINDATA))  // 解析为数据包
        {
            memcpy(data, webSocketPackage, retLen);     // 把解析得到的数据复制出去
            /*
            // 显示数据
            if(webSocketPackage[0] >= ' ' && webSocketPackage[0] <= '~')
            {
                printf("\r\nwebSocket_recv : New Package StrFile ret2:%d/retLen:%d\r\n%s\r\n" , ret2, retLen, webSocketPackage);
            }
            else
            {
                printf("\r\nwebSocket_recv : New Package BinFile ret2:%d/retLen:%d\r\n" , ret2, retLen);
                for(i = 0; i < retLen; i++) printf("%.2X ", webSocketPackage[i]); printf("\r\n");
            }*/
            free(recvBuf);
            free(webSocketPackage);
            return retLen;
        }/*
        else
        {
            // 显示数据
            if(recvBuf[0] >= ' ' && recvBuf[0] <= '~')
                printf("\r\nwebSocket_recv : ret:%d/ret2:%d/retLen:%d\r\n%s\r\n" , ret, ret2, retLen, recvBuf);
            else
            {
                printf("\r\nwebSocket_recv : ret:%d/ret2:%d/retLen:%d\r\n%s\r\n" , ret, ret2, retLen, recvBuf);
                for(i = 0; i < ret; i++) printf("%.2X ", recvBuf[i]); printf("\r\n");
            }
        }*/
        free(recvBuf);
        free(webSocketPackage);
        return -ret;
    }
    else
    {
        free(recvBuf);
        return ret;
    }
}